

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# densematrix.cc
# Opt level: O3

real __thiscall fasttext::DenseMatrix::dotRow(DenseMatrix *this,Vector *vec,int64_t i)

{
  size_t sVar1;
  ulong uVar2;
  undefined1 auVar3 [16];
  EncounteredNaNError *this_00;
  ulong uVar4;
  size_t sVar5;
  ulong uVar6;
  undefined1 auVar7 [64];
  
  if (i < 0) {
    __assert_fail("i >= 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/facebookresearch[P]fastText/src/densematrix.cc"
                  ,0x71,"virtual real fasttext::DenseMatrix::dotRow(const Vector &, int64_t) const")
    ;
  }
  if ((this->super_Matrix).m_ <= i) {
    __assert_fail("i < m_",
                  "/workspace/llm4binary/github/license_c_cmakelists/facebookresearch[P]fastText/src/densematrix.cc"
                  ,0x72,"virtual real fasttext::DenseMatrix::dotRow(const Vector &, int64_t) const")
    ;
  }
  sVar1 = (vec->data_).size_;
  if (sVar1 != (this->super_Matrix).n_) {
    __assert_fail("vec.size() == n_",
                  "/workspace/llm4binary/github/license_c_cmakelists/facebookresearch[P]fastText/src/densematrix.cc"
                  ,0x73,"virtual real fasttext::DenseMatrix::dotRow(const Vector &, int64_t) const")
    ;
  }
  if ((long)sVar1 < 1) {
    auVar7 = ZEXT864(0);
  }
  else {
    uVar2 = (this->data_).size_;
    uVar4 = i * sVar1;
    uVar6 = 0;
    if (uVar4 <= uVar2) {
      uVar6 = uVar2 - uVar4;
    }
    if (uVar6 <= sVar1 - 1) {
      __assert_fail("i * n_ + j < data_.size()",
                    "/workspace/llm4binary/github/license_c_cmakelists/facebookresearch[P]fastText/src/densematrix.h"
                    ,0x31,"const real &fasttext::DenseMatrix::at(int64_t, int64_t) const");
    }
    auVar7 = ZEXT864(0);
    sVar5 = 0;
    do {
      auVar3 = vfmadd231ss_fma(auVar7._0_16_,ZEXT416((uint)(this->data_).mem_[uVar4 + sVar5]),
                               ZEXT416((uint)(vec->data_).mem_[sVar5]));
      auVar7 = ZEXT1664(auVar3);
      sVar5 = sVar5 + 1;
    } while (sVar1 != sVar5);
    if (NAN(auVar3._0_4_)) {
      this_00 = (EncounteredNaNError *)__cxa_allocate_exception(0x10);
      EncounteredNaNError::EncounteredNaNError(this_00);
      __cxa_throw(this_00,&EncounteredNaNError::typeinfo,std::runtime_error::~runtime_error);
    }
  }
  return auVar7._0_4_;
}

Assistant:

real DenseMatrix::dotRow(const Vector& vec, int64_t i) const {
  assert(i >= 0);
  assert(i < m_);
  assert(vec.size() == n_);
  real d = 0.0;
  for (int64_t j = 0; j < n_; j++) {
    d += at(i, j) * vec[j];
  }
  if (std::isnan(d)) {
    throw EncounteredNaNError();
  }
  return d;
}